

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_reportModelMPS(HModel *this,char *filename)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  pointer piVar7;
  int i;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  char buff [55];
  ofstream output;
  undefined8 auStack_228 [63];
  
  std::ofstream::ofstream((ostream *)&output,filename,_S_out);
  poVar6 = std::operator<<((ostream *)&output,"NAME");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,(string *)&this->modelName);
  poVar6 = std::operator<<(poVar6," SIZE: N=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->numCol);
  poVar6 = std::operator<<(poVar6,",  M=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->numRow);
  poVar6 = std::operator<<(poVar6,", NZ=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,'\n');
  std::operator<<((ostream *)&output,"ROWS\n");
  for (iVar8 = 1; iVar8 <= this->numRow; iVar8 = iVar8 + 1) {
    poVar6 = std::operator<<((ostream *)&output," E  R");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
    std::operator<<(poVar6,"\n");
  }
  poVar6 = std::operator<<((ostream *)&output," N  COST");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&output,"COLUMNS\n");
  *(undefined8 *)((long)auStack_228 + *(long *)(_output + -0x18)) = 10;
  bVar4 = true;
  bVar5 = true;
  iVar8 = 0;
  lVar10 = 0;
  while (piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, iVar8 < piVar7[this->numCol]) {
    lVar1 = lVar10 + 1;
    lVar9 = (long)iVar8;
    while( true ) {
      if (piVar7[lVar10 + 1] <= lVar9) break;
      dVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      bVar4 = !bVar4;
      if (bVar4) {
        sprintf(buff,"        R%-3d %12f",dVar3,
                (ulong)((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9] + 1));
        poVar6 = std::operator<<((ostream *)&output,buff);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        sprintf(buff,"    C%-3d      R%-3d %12f",dVar3,lVar1);
        std::operator<<((ostream *)&output,buff);
      }
      lVar9 = lVar9 + 1;
      piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = iVar8 + 1;
      bVar5 = bVar4;
    }
    if (!bVar5) {
      bVar4 = true;
      bVar5 = true;
      std::endl<char,std::char_traits<char>>((ostream *)&output);
    }
    pdVar2 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar10;
    lVar10 = lVar1;
    if (*pdVar2 != 0.0) {
      sprintf(buff,"    C%-3d      COST %12f",lVar1);
      poVar6 = std::operator<<((ostream *)&output,buff);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  *(undefined8 *)((long)auStack_228 + *(long *)(_output + -0x18)) = 10;
  std::operator<<((ostream *)&output,"RHS\n");
  bVar4 = true;
  uVar11 = 0;
  do {
    uVar12 = uVar11;
    do {
      uVar11 = uVar12 + 1;
      if ((long)this->numRow <= (long)uVar12) {
        if (!bVar4) {
          std::endl<char,std::char_traits<char>>((ostream *)&output);
        }
        std::operator<<((ostream *)&output,"BOUNDS\n");
        for (lVar10 = 0; uVar11 = (ulong)this->numCol, lVar10 < (long)uVar11; lVar10 = lVar10 + 1) {
          if ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] < 1e+200) {
            sprintf(buff,"  UP BND     C%-3d %12g\n",(ulong)((int)lVar10 + 1));
            std::operator<<((ostream *)&output,buff);
          }
        }
        uVar12 = 0;
        do {
          do {
            if ((long)(int)uVar11 <= (long)uVar12) {
              std::operator<<((ostream *)&output,"ENDATA");
              std::ofstream::close();
              std::ofstream::~ofstream(&output);
              return;
            }
            pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar12;
            uVar12 = uVar12 + 1;
          } while (*pdVar2 == 0.0);
          sprintf(buff,"  LO BND     C%-3d %12g\n",uVar12 & 0xffffffff);
          std::operator<<((ostream *)&output,buff);
          uVar11 = (ulong)(uint)this->numCol;
        } while( true );
      }
      pdVar2 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12;
      uVar12 = uVar11;
    } while (*pdVar2 == 0.0);
    if (bVar4) {
      sprintf(buff,"    DEMANDS   R%-3d %12g",uVar11 & 0xffffffff);
      bVar4 = false;
      std::operator<<((ostream *)&output,buff);
    }
    else {
      sprintf(buff,"        R%-3d %12g",uVar11 & 0xffffffff);
      poVar6 = std::operator<<((ostream *)&output,buff);
      std::endl<char,std::char_traits<char>>(poVar6);
      bVar4 = true;
    }
  } while( true );
}

Assistant:

void HModel::util_reportModelMPS(const char *filename) {
  ofstream output(filename);
  //COLUMNS are numCol + #constr with upper bound + #constr with lower bound: numColU and numColL
  output<<"NAME"<<"\t"<<modelName<<" SIZE: N="<<numCol<<",  M="<<numRow<<", NZ="<<Aindex.size()<<'\n';	

  output << "ROWS\n";
  for (int i = 1; i <= numRow; i++) {
    output << " E  R"<< i << "\n";
  }
  output << " N  COST"<<endl;
  output <<"COLUMNS\n";
  output << setprecision(10);
  
  char buff [55];
  
  int j=0; //element index
  int k=0; //column index
  bool ll=true;
  while (j<Astart[numCol]) {
    while (j<Astart[k+1]) {
      if (ll) {
	sprintf(buff, "    C%-3d      R%-3d %12f", k+1,  Aindex[j]+1, Avalue[j]);
	output<<buff;
	ll = false;
	j++;
      }
      else {
	sprintf(buff, "        R%-3d %12f", Aindex[j]+1, Avalue[j]);
	output<<buff<<endl;
	ll=true;
	j++;					
      }
    }
    if (!ll) {
      output<<endl;
      ll = true;
    }
    if (fabs(colCost[k])>0) {
      sprintf(buff, "    C%-3d      COST %12f", k+1,  colCost[k]);
      output<<buff<<endl;
    }
    k++;
  }
  
  output << setprecision(10);
  output <<"RHS\n"; //RHS for all cases
  ll = true;
  for (int i=0;i<numRow;i++) 
    if (fabs(rowUpper[i])>0) {
      if (ll) {
	sprintf(buff,"    DEMANDS   R%-3d %12g", i+1, rowUpper[i]);
	output<<buff;
	ll = false;
      }
      else {
	sprintf(buff,"        R%-3d %12g", i+1, rowUpper[i]);
	output<<buff<<endl;
	ll=true;					
      }
    }
  
  
  if (!ll)
    output<<endl;
  //omega and gamma by default have lb 0 and ub infinity, edit in future if needed
  output <<"BOUNDS\n";
  for (int i=0;i<numCol;i++) 
    if (colUpper[i]<HSOL_CONST_INF)  {
      sprintf(buff,"  UP BND     C%-3d %12g\n", i+1, colUpper[i]);
      output<<buff;
    }
  
  
  for (int i=0;i<numCol;i++) 
    if (fabs(colLower[i])>0) {
      sprintf(buff,"  LO BND     C%-3d %12g\n", i+1, colLower[i]);
      output<<buff;
    }
  
  output <<"ENDATA";
  
  output.close();
}